

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncInfo.h
# Opt level: O3

RegSlot __thiscall FuncInfo::NextConstRegister(FuncInfo *this)

{
  RegSlot RVar1;
  code *pcVar2;
  bool bVar3;
  RegSlot RVar4;
  undefined4 *puVar5;
  
  if (this->firstTmpReg != 0xffffffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/FuncInfo.h"
                       ,0xe8,"(this->firstTmpReg == Js::Constants::NoRegister)",
                       "Shouldn\'t assign var register after we start allocating temp reg");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  RVar1 = this->constRegsCount;
  RVar4 = RVar1 + 1;
  this->constRegsCount = RVar4;
  if (RVar4 != 0) {
    return -RVar1 - 2;
  }
  Math::DefaultOverflowPolicy();
}

Assistant:

Js::RegSlot NextConstRegister()
    {
        AssertMsg(this->firstTmpReg == Js::Constants::NoRegister, "Shouldn't assign var register after we start allocating temp reg");
        Js::RegSlot reg = constRegsCount;
        UInt32Math::Inc(constRegsCount);
        return REGSLOT_TO_CONSTREG(reg);
    }